

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,Annotation *annotation)

{
  CodePrinter *this_00;
  bool in_R8B;
  string_view text;
  string local_30;
  
  this_00 = this->out;
  annotationToString_abi_cxx11_
            (&local_30,(soul *)&annotation->dictionary,
             (StringDictionary *)
             (annotation->properties)._M_t.
             super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
             .
             super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
             ._M_head_impl,
             (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)0x0,
             in_R8B);
  text._M_str = local_30._M_dataplus._M_p;
  text._M_len = local_30._M_string_length;
  choc::text::CodePrinter::writeBlock(this_00,text);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void printDescription (const Annotation& annotation)
        {
            out << annotation.toHEART();
        }